

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XPathMatcher::endElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,XMLCh *elemContent,
          ValidationContext *validationContext,DatatypeValidator *actualValidator)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ValueStackOf<unsigned_long> *this_00;
  unsigned_long uVar4;
  undefined4 extraout_var;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  uchar *puVar5;
  DatatypeValidator *pDVar6;
  ulong getAt;
  XMLSize_t XVar7;
  XMLBuffer buff;
  ArrayJanitor<char16_t> janPrefix;
  undefined4 extraout_var_00;
  
  for (getAt = 0; getAt < this->fLocationPathSize; getAt = getAt + 1) {
    this_00 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                        (&this->fStepIndexes->
                          super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,getAt);
    uVar4 = ValueStackOf<unsigned_long>::pop(this_00);
    this->fCurrentStep[getAt] = uVar4;
    XVar7 = this->fNoMatchDepth[getAt];
    if (XVar7 == 0) {
      puVar5 = this->fMatched;
      if (puVar5[getAt] != 0) {
        if ((~puVar5[getAt] & 3) != 0) {
          pDVar6 = actualValidator;
          if (actualValidator == (DatatypeValidator *)0x0) {
            pDVar6 = *(DatatypeValidator **)&elemDecl[2].fCreateReason;
          }
          uVar1 = *(uint *)&elemDecl[1].fElementName;
          if ((pDVar6 == (DatatypeValidator *)0x0) || (pDVar6->fType != QName)) {
            (*this->_vptr_XPathMatcher[6])(this,elemContent,pDVar6,(ulong)(uVar1 & 1));
          }
          else {
            iVar2 = XMLString::indexOf(elemContent,L':');
            if (iVar2 == -1) {
              (*this->_vptr_XPathMatcher[6])(this,elemContent,pDVar6,(ulong)(uVar1 & 1));
            }
            else {
              buff.fMemoryManager = this->fMemoryManager;
              buff.fIndex = 0;
              buff.fCapacity = 0x3ff;
              buff.fFullSize = 0;
              buff.fUsed = false;
              buff.fFullHandler = (XMLBufferFullHandler *)0x0;
              buff.fBuffer = (XMLCh *)0x0;
              iVar3 = (*(buff.fMemoryManager)->_vptr_MemoryManager[3])(buff.fMemoryManager,0x800);
              buff.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
              *buff.fBuffer = L'\0';
              XMLBuffer::append(&buff,L'{');
              XVar7 = (XMLSize_t)iVar2;
              if (validationContext != (ValidationContext *)0x0) {
                iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                  (this->fMemoryManager,XVar7 * 2 + 2);
                toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
                ArrayJanitor<char16_t>::ArrayJanitor(&janPrefix,toDelete,this->fMemoryManager);
                XMLString::subString(toDelete,elemContent,0,XVar7,this->fMemoryManager);
                iVar2 = (*validationContext->_vptr_ValidationContext[0xf])
                                  (validationContext,toDelete);
                XMLBuffer::append(&buff,(XMLCh *)CONCAT44(extraout_var_01,iVar2));
                ArrayJanitor<char16_t>::~ArrayJanitor(&janPrefix);
              }
              XMLBuffer::append(&buff,L'}');
              XMLBuffer::append(&buff,elemContent + XVar7 + 1);
              buff.fBuffer[buff.fIndex] = L'\0';
              (*this->_vptr_XPathMatcher[6])(this,buff.fBuffer,pDVar6,(ulong)(uVar1 & 1));
              XMLBuffer::~XMLBuffer(&buff);
            }
          }
          puVar5 = this->fMatched;
        }
        puVar5[getAt] = '\0';
      }
    }
    else {
      this->fNoMatchDepth[getAt] = XVar7 - 1;
    }
  }
  return;
}

Assistant:

void XPathMatcher::endElement(const XMLElementDecl& elemDecl,
                              const XMLCh* const elemContent,
                              ValidationContext* validationContext /*=0*/,
                              DatatypeValidator* actualValidator /*=0*/) {

    for(XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // go back a step
        fCurrentStep[i] = fStepIndexes->elementAt(i)->pop();

        // don't do anything, if not matching
        if (fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]--;
        }
        // signal match, if appropriate
        else {

            if (fMatched[i] == 0)
                continue;
            
            if ((fMatched[i] & XP_MATCHED_A) == XP_MATCHED_A) {
                fMatched[i] = 0;
                continue;
            }

            DatatypeValidator* dv = actualValidator?actualValidator:((SchemaElementDecl*) &elemDecl)->getDatatypeValidator();
            bool isNillable = (((SchemaElementDecl *) &elemDecl)->getMiscFlags() & SchemaSymbols::XSD_NILLABLE) != 0;

            // store QName using their Clark name
            if(dv && dv->getType()==DatatypeValidator::QName)
            {
                int index=XMLString::indexOf(elemContent, chColon);
                if(index==-1)
                    matched(elemContent, dv, isNillable);
                else
                {
                    XMLBuffer buff(1023, fMemoryManager);
                    buff.append(chOpenCurly);
                    if(validationContext)
                    {
                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                        XMLString::subString(prefix, elemContent, 0, (XMLSize_t)index, fMemoryManager);
                        buff.append(validationContext->getURIForPrefix(prefix));
                    }
                    buff.append(chCloseCurly);
                    buff.append(elemContent+index+1);
                    matched(buff.getRawBuffer(), dv, isNillable);
                }
            }
            else
                matched(elemContent, dv, isNillable);
            fMatched[i] = 0;
        }
    }
}